

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O1

void __thiscall
QtMWidgets::DateTimePickerPrivate::drawWindow
          (DateTimePickerPrivate *this,QPainter *p,QStyleOption *opt)

{
  int iVar1;
  ColorGroup CVar2;
  long *plVar3;
  int iVar4;
  int iVar5;
  QColor QVar6;
  QColor baseColor;
  QLinearGradient g;
  QColor c1;
  QPointF local_108;
  QColor local_f8;
  QPointF local_e0;
  QColor local_d0;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined2 local_b4;
  QColor local_b0 [5];
  QColor local_58;
  undefined8 local_40;
  undefined4 local_38;
  undefined2 local_34;
  
  iVar1 = this->itemHeight;
  iVar4 = iVar1 + 3;
  if (-1 < iVar1) {
    iVar4 = iVar1;
  }
  iVar1 = iVar1 + (iVar4 >> 2) * 2;
  iVar4 = this->currentItemY - (iVar4 >> 2);
  iVar5 = (iVar1 - (iVar1 >> 0x1f) & 0xfffffffeU) + iVar4;
  CVar2 = QWidget::palette();
  plVar3 = (long *)QPalette::brush(CVar2,Dark);
  local_f8._0_8_ = *(undefined8 *)(*plVar3 + 8);
  local_f8._8_8_ = *(undefined8 *)(*plVar3 + 0x10);
  local_58._0_8_ = local_f8._0_8_;
  local_58._8_8_ = local_f8._8_8_;
  QColor::setAlpha((int)&local_58);
  QPainter::setPen((QColor *)p);
  local_b0[0].ct._4_4_ = (*(int *)(opt + 0x18) - *(int *)(opt + 0x10)) + 1;
  local_b0[0].cspec = Invalid;
  local_b0[0].ct._0_4_ = iVar4;
  local_b0[0]._12_4_ = iVar4;
  QPainter::drawLines((QLine *)p,(int)local_b0);
  local_b0[0].ct._4_4_ = (*(int *)(opt + 0x18) - *(int *)(opt + 0x10)) + 1;
  local_b0[0].cspec = Invalid;
  local_b0[0].ct._0_4_ = iVar5;
  local_b0[0]._12_4_ = iVar5;
  QPainter::drawLines((QLine *)p,(int)local_b0);
  QVar6 = lighterColor(&local_f8,0x6e);
  local_40 = QVar6._0_8_;
  local_38 = QVar6.ct._4_4_;
  local_34 = QVar6.ct._8_2_;
  QColor::setAlpha((int)&local_40);
  QPainter::setPen((QColor *)p);
  local_b0[0].ct._0_4_ = iVar4 + 1;
  local_b0[0].ct._4_4_ = (*(int *)(opt + 0x18) - *(int *)(opt + 0x10)) + 1;
  local_b0[0].cspec = Invalid;
  local_b0[0]._12_4_ = iVar4 + 2U;
  QPainter::drawLines((QLine *)p,(int)local_b0);
  local_108.xp = 0.0;
  local_108.yp = 0.0;
  local_e0.xp = 0.0;
  local_e0.yp = 1.0;
  QLinearGradient::QLinearGradient((QLinearGradient *)local_b0,&local_108,&local_e0);
  QGradient::setCoordinateMode((CoordinateMode)local_b0);
  QVar6 = lighterColor(&local_f8,0x5f);
  local_e0.xp = QVar6._0_8_;
  local_e0.yp._0_6_ = QVar6.ct._4_6_;
  QColor::setAlpha((int)&local_e0);
  QGradient::setColorAt(0.0,local_b0);
  QVar6 = lighterColor(&local_f8,0x32);
  local_c0 = QVar6._0_8_;
  local_b8 = QVar6.ct._4_4_;
  local_b4 = QVar6.ct._8_2_;
  QColor::setAlpha((int)&local_c0);
  QGradient::setColorAt(1.0,local_b0);
  QPainter::setPen((PenStyle)p);
  QBrush::QBrush((QBrush *)&local_108,(QGradient *)local_b0);
  QPainter::setBrush((QBrush *)p);
  iVar1 = iVar1 / 2;
  QBrush::~QBrush((QBrush *)&local_108);
  local_108.xp = (qreal)((ulong)(iVar4 + 2U) << 0x20);
  local_108.yp = (qreal)CONCAT44(iVar1 + -1 + iVar4,*(int *)(opt + 0x18) - *(int *)(opt + 0x10));
  QPainter::drawRects((QRect *)p,(int)&local_108);
  QVar6 = lighterColor(&local_f8,0x23);
  local_d0._0_8_ = QVar6._0_8_;
  local_d0.ct._4_4_ = QVar6.ct._4_4_;
  local_d0.ct.argb.pad = QVar6.ct._8_2_;
  QColor::setAlpha((int)&local_d0);
  QBrush::QBrush((QBrush *)&local_108,&local_d0,SolidPattern);
  QPainter::setBrush((QBrush *)p);
  QBrush::~QBrush((QBrush *)&local_108);
  local_108.xp = (qreal)((ulong)(uint)(iVar4 + iVar1) << 0x20);
  local_108.yp = (qreal)CONCAT44(iVar1 + -1 + iVar4 + iVar1,
                                 *(int *)(opt + 0x18) - *(int *)(opt + 0x10));
  QPainter::drawRects((QRect *)p,(int)&local_108);
  QLinearGradient::~QLinearGradient((QLinearGradient *)local_b0);
  return;
}

Assistant:

void
DateTimePickerPrivate::drawWindow( QPainter * p, const QStyleOption & opt )
{
	const int windowOffset = itemHeight / 4;
	const int windowHeight = itemHeight + windowOffset * 2;
	const int windowMiddleHeight = windowHeight / 2;

	const int alpha = 150;
	const int alpha2 = 255;

	int yTop = currentItemY - windowOffset;
	int yBottom = yTop + windowMiddleHeight * 2;

	const QColor baseColor = q->palette().color( QPalette::Dark );

	QColor c1 = baseColor;
	c1.setAlpha( alpha2 );
	p->setPen( c1 );

	p->drawLine( 0, yTop, opt.rect.width(), yTop );
	p->drawLine( 0, yBottom, opt.rect.width(), yBottom );

	QColor c2 = lighterColor( baseColor, 110 );
	c2.setAlpha( alpha2 );
	p->setPen( c2 );

	p->drawLine( 0, yTop + 1, opt.rect.width(), yTop + 2 );

	QLinearGradient g( QPointF( 0.0, 0.0 ), QPointF( 0.0, 1.0 ) );
	g.setCoordinateMode( QGradient::ObjectBoundingMode );

	QColor c3 = lighterColor( baseColor, 95 );
	c3.setAlpha( alpha );
	g.setColorAt( 0.0, c3 );

	QColor c4 = lighterColor( baseColor, 50 );
	c4.setAlpha( alpha );
	g.setColorAt( 1.0, c4 );

	p->setPen( Qt::NoPen );
	p->setBrush( g );

	p->drawRect( 0, yTop + 2, opt.rect.width(), windowMiddleHeight - 2 );

	QColor c5 = lighterColor( baseColor, 35 );
	c5.setAlpha( alpha );
	p->setBrush( c5 );
	p->drawRect( 0, yTop + windowMiddleHeight,
		opt.rect.width(), windowMiddleHeight );
}